

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_extension_install_info.cpp
# Opt level: O0

unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
duckdb::ExtensionInstallInfo::Deserialize(Deserializer *deserializer)

{
  undefined8 *puVar1;
  pointer ret;
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
  *in_RSI;
  _Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false> in_RDI;
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
  *result;
  pointer in_stack_ffffffffffffff58;
  ExtensionInstallInfo *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  field_id_t field_id;
  Deserializer *in_stack_ffffffffffffff70;
  field_id_t field_id_00;
  Deserializer *this;
  
  field_id = (field_id_t)((ulong)in_stack_ffffffffffffff68 >> 0x30);
  puVar1 = (undefined8 *)operator_new(0x88);
  field_id_00 = 0;
  this = (Deserializer *)0x0;
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[0x10] = 0;
  ExtensionInstallInfo(in_stack_ffffffffffffff60);
  unique_ptr<duckdb::ExtensionInstallInfo,std::default_delete<duckdb::ExtensionInstallInfo>,true>::
  unique_ptr<std::default_delete<duckdb::ExtensionInstallInfo>,void>
            ((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
              *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
  ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                *)in_stack_ffffffffffffff60);
  Deserializer::ReadProperty<duckdb::ExtensionInstallMode>
            (in_stack_ffffffffffffff70,field_id,(char *)in_stack_ffffffffffffff60,
             &in_stack_ffffffffffffff58->mode);
  ret = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
        ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                      *)in_stack_ffffffffffffff60);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (this,field_id_00,(char *)in_RDI._M_head_impl,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ret);
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
  ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                *)in_stack_ffffffffffffff60);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (this,field_id_00,(char *)in_RDI._M_head_impl,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ret);
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
  ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                *)in_stack_ffffffffffffff60);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (this,field_id_00,(char *)in_RDI._M_head_impl,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ret);
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
  ::operator->(in_RSI);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (this,field_id_00,(char *)in_RDI._M_head_impl,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ret);
  return (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          )(_Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            )in_RDI._M_head_impl;
}

Assistant:

unique_ptr<ExtensionInstallInfo> ExtensionInstallInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ExtensionInstallInfo>(new ExtensionInstallInfo());
	deserializer.ReadProperty<ExtensionInstallMode>(100, "mode", result->mode);
	deserializer.ReadPropertyWithDefault<string>(101, "full_path", result->full_path);
	deserializer.ReadPropertyWithDefault<string>(102, "repository_url", result->repository_url);
	deserializer.ReadPropertyWithDefault<string>(103, "version", result->version);
	deserializer.ReadPropertyWithDefault<string>(104, "etag", result->etag);
	return result;
}